

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapRule.c
# Opt level: O0

int Amap_CreateCheckAllZero(Vec_Ptr_t *vVecNods)

{
  int iVar1;
  Vec_Int_t *p;
  int local_24;
  int i;
  Vec_Int_t *vNods;
  Vec_Ptr_t *vVecNods_local;
  
  local_24 = Vec_PtrSize(vVecNods);
  do {
    local_24 = local_24 + -1;
    if (local_24 < 0) {
      return 1;
    }
    p = (Vec_Int_t *)Vec_PtrEntry(vVecNods,local_24);
    iVar1 = Vec_IntSize(p);
  } while ((iVar1 == 1) && (iVar1 = Vec_IntEntry(p,0), iVar1 == 0));
  return 0;
}

Assistant:

int Amap_CreateCheckAllZero( Vec_Ptr_t * vVecNods )
{
    Vec_Int_t * vNods;
    int i;
    Vec_PtrForEachEntryReverse( Vec_Int_t *, vVecNods, vNods, i )
        if ( Vec_IntSize(vNods) != 1 || Vec_IntEntry(vNods,0) != 0 )
            return 0;
    return 1;
}